

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall
wasm::BinaryInstWriter::visitArrayInitElem(BinaryInstWriter *this,ArrayInitElem *curr)

{
  WasmBinaryWriter *this_00;
  BufferWithRandomAccess *this_01;
  bool bVar1;
  U32LEB x;
  HeapType type;
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    emitUnreachable(this);
    return;
  }
  BufferWithRandomAccess::operator<<(this->o,-5);
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x13);
  this_00 = this->parent;
  type = wasm::Type::getHeapType(&curr->ref->type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,type);
  this_01 = this->o;
  x.value = WasmBinaryWriter::getElementSegmentIndex
                      (this->parent,(Name)(curr->segment).super_IString.str);
  BufferWithRandomAccess::operator<<(this_01,x);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayInitElem(ArrayInitElem* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::GCPrefix);
  o << U32LEB(BinaryConsts::ArrayInitElem);
  parent.writeIndexedHeapType(curr->ref->type.getHeapType());
  o << U32LEB(parent.getElementSegmentIndex(curr->segment));
}